

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::remove_web_seed(torrent *this,string *url)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *plVar1;
  byte bVar2;
  pointer __s2;
  _List_node_base *p_Var3;
  _List_node_base *__n;
  int iVar4;
  iterator web;
  
  plVar1 = &this->m_web_seeds;
  web._M_node = (this->m_web_seeds).
                super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                ._M_impl._M_node.super__List_node_base._M_next;
  if (web._M_node != (_List_node_base *)plVar1) {
    __s2 = (url->_M_dataplus)._M_p;
    p_Var3 = (_List_node_base *)url->_M_string_length;
    do {
      __n = web._M_node[1]._M_prev;
      if (__n == p_Var3) {
        if (__n == (_List_node_base *)0x0) break;
        iVar4 = bcmp(web._M_node[1]._M_next,__s2,(size_t)__n);
        if (iVar4 == 0) break;
      }
      web._M_node = (web._M_node)->_M_next;
    } while (web._M_node != (_List_node_base *)plVar1);
  }
  if (web._M_node != (_List_node_base *)plVar1) {
    if ((*(char *)((long)&web._M_node[0xb]._M_next + 4) == '\0') &&
       (bVar2 = (this->m_need_save_resume_data).m_val, -1 < (char)bVar2)) {
      (this->m_need_save_resume_data).m_val = bVar2 | 0x80;
      state_updated(this);
    }
    remove_web_seed_iter(this,web);
    return;
  }
  return;
}

Assistant:

void torrent::remove_web_seed(std::string const& url)
	{
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [&] (web_seed_t const& w) { return w.url == url; });

		if (i != m_web_seeds.end())
		{
			if (!i->ephemeral)
				set_need_save_resume(torrent_handle::if_metadata_changed);
			remove_web_seed_iter(i);
		}
	}